

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>
     *this,int i)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  int in_stack_ffffffffffffffbc;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *in_stack_ffffffffffffffc0;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
          ::dx((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  vVar2 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x1858d37);
  vVar3 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::dx
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  vVar4 = FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
                 *)0x1858d62);
  vVar5 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x1858dae);
  vVar6 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x1858dc2);
  return (vVar1 * vVar2 + -(vVar3 * vVar4)) / (vVar5 * vVar6);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}